

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O1

void hit_prog_essence_light(OBJ_DATA *obj,CHAR_DATA *ch,CHAR_DATA *victim,int damage)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if (0 < damage) {
    bVar2 = is_npc(victim);
    if (((bVar2) && ((victim->act[0] & 0x4000) != 0)) || ((victim->form[0] & 0x100) != 0)) {
      act("$p erupts with an unfathomable radiance, engulfing $N!",ch,obj,victim,3);
      act("A blinding radiance billows forth from $n, engulfing $N!",ch,obj,victim,1);
      act("$N lets out a terrifying preternatural wail, and crumbles to dust!",ch,obj,victim,4);
      raw_kill(ch,victim);
      return;
    }
    bVar2 = is_good(victim);
    if (bVar2) {
      if (victim->hit < (int)victim->max_hit) {
        iVar3 = number_percent();
        if (iVar3 < 0x33) {
          act("A pearly luminescence flows into $n\'s wounds.",victim,obj,ch,0);
          act("A pearly luminescence flows into your wounds.",victim,obj,ch,3);
          send_to_char("You feel healed!\n\r",victim);
          sVar1 = victim->max_hit;
          iVar3 = victim->hit;
          iVar4 = dice(8,8);
          iVar4 = iVar4 + iVar3;
          if (sVar1 <= iVar4) {
            iVar4 = (int)sVar1;
          }
          victim->hit = iVar4;
        }
      }
    }
    else {
      bVar2 = is_neutral(victim);
      if (bVar2) {
        iVar3 = number_percent();
        if (iVar3 < 0x33) {
          act("A reluctant light flickers in $n\'s hands and lashes out!",ch,obj,victim,0);
          act("A reluctant light flickers in your hands and lashes out!",ch,obj,victim,3);
          iVar3 = dice(3,(int)ch->level);
          damage_new(ch,victim,iVar3,-1,10,true,false,0,1,"torrent of light");
        }
      }
      else {
        act("Waves of brilliant white light cascade from your hands, searing $n!",victim,obj,ch,2);
        act("Waves of brilliant white light cascade from $N\'s hands, searing $n!",victim,obj,ch,1);
        act("Waves of brilliant white light cascade from $N\'s hands, searing you!",victim,obj,ch,3)
        ;
        iVar3 = dice((int)ch->level,5);
        damage_new(ch,victim,iVar3,-1,0x13,true,false,0,1,"blinding fury");
        iVar3 = number_percent();
        if (iVar3 < 0x15) {
          iVar3 = number_range(1,4);
          if (iVar3 - 1U < 2) {
            act("You reel in agony as the raw energy engulfs you!",victim,(void *)0x0,ch,3);
            act("$n staggers as the raw energy engulfs $m!",victim,(void *)0x0,ch,0);
            LAG_CHAR(victim,0xc);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void hit_prog_essence_light(OBJ_DATA *obj, CHAR_DATA *ch, CHAR_DATA *victim, int damage)
{
	if (damage <= 0)
		return;

	if (!(is_npc(victim) && IS_SET(victim->act, ACT_UNDEAD)) && !IS_SET(victim->form, FORM_UNDEAD))
	{
		if (is_good(victim))
		{
			if (victim->hit < victim->max_hit && number_percent() <= 50)
			{
				act("A pearly luminescence flows into $n's wounds.", victim, obj, ch, TO_ROOM);
				act("A pearly luminescence flows into your wounds.", victim, obj, ch, TO_CHAR);
				send_to_char("You feel healed!\n\r", victim);
				victim->hit = std::min((int)victim->max_hit, victim->hit + dice(8, 8));
			}
		}
		else if (is_neutral(victim))
		{
			if (number_percent() <= 50)
			{
				act("A reluctant light flickers in $n's hands and lashes out!", ch, obj, victim, TO_ROOM);
				act("A reluctant light flickers in your hands and lashes out!", ch, obj, victim, TO_CHAR);
				damage_new(ch, victim, dice(3, ch->level), TYPE_UNDEFINED, DAM_HOLY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "torrent of light");
			}
		}
		else
		{
			act("Waves of brilliant white light cascade from your hands, searing $n!", victim, obj, ch, TO_VICT);
			act("Waves of brilliant white light cascade from $N's hands, searing $n!", victim, obj, ch, TO_NOTVICT);
			act("Waves of brilliant white light cascade from $N's hands, searing you!", victim, obj, ch, TO_CHAR);
			damage_new(ch, victim, dice(ch->level, 5), TYPE_UNDEFINED, DAM_TRUESTRIKE, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "blinding fury");

			if (number_percent() <= 20)
			{
				switch (number_range(1, 4))
				{
					case 1:
					case 2:
						act("You reel in agony as the raw energy engulfs you!", victim, 0, ch, TO_CHAR);
						act("$n staggers as the raw energy engulfs $m!", victim, 0, ch, TO_ROOM);
						LAG_CHAR(victim, PULSE_VIOLENCE);
						break;
				}
			}
		}
	}
	else
	{
		act("$p erupts with an unfathomable radiance, engulfing $N!", ch, obj, victim, TO_CHAR);
		act("A blinding radiance billows forth from $n, engulfing $N!", ch, obj, victim, TO_NOTVICT);
		act("$N lets out a terrifying preternatural wail, and crumbles to dust!", ch, obj, victim, TO_ALL);
		raw_kill(ch, victim);
	}
}